

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void disas_suba(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx_00;
  TCGv_i32 arg2;
  TCGv_i32 ret;
  int opsize;
  TCGv_i32 reg;
  TCGv_i32 src;
  TCGContext_conflict2 *tcg_ctx;
  uint16_t insn_local;
  DisasContext_conflict2 *s_local;
  CPUM68KState_conflict *env_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  opsize = 1;
  if ((insn & 0x100) != 0) {
    opsize = 2;
  }
  arg2 = gen_ea(env,s,insn,opsize,tcg_ctx_00->NULL_QREG,(TCGv_i32 *)0x0,EA_LOADS,
                (uint)(((((s->base).tb)->flags & 0x2000) != 0 ^ 0xffU) & 1));
  if (arg2 == tcg_ctx_00->NULL_QREG) {
    gen_addr_fault(s);
  }
  else {
    ret = get_areg(s,(int)(uint)insn >> 9 & 7);
    tcg_gen_sub_i32(tcg_ctx_00,ret,ret,arg2);
  }
  return;
}

Assistant:

DISAS_INSN(suba)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv src;
    TCGv reg;

    SRC_EA(env, src, (insn & 0x100) ? OS_LONG : OS_WORD, 1, NULL);
    reg = AREG(insn, 9);
    tcg_gen_sub_i32(tcg_ctx, reg, reg, src);
}